

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::ColorEdit3(char *label,float *col)

{
  bool bVar1;
  float local_28;
  float fStack_24;
  bool value_changed;
  float col4 [4];
  float *col_local;
  char *label_local;
  
  local_28 = *col;
  fStack_24 = col[1];
  col4[0] = col[2];
  col4[1] = 1.0;
  col4._8_8_ = col;
  bVar1 = ColorEdit4(label,&local_28,false);
  *(float *)col4._8_8_ = local_28;
  *(float *)(col4._8_8_ + 4) = fStack_24;
  *(float *)(col4._8_8_ + 8) = col4[0];
  return bVar1;
}

Assistant:

bool ImGui::ColorEdit3(const char* label, float col[3])
{
    float col4[4];
    col4[0] = col[0];
    col4[1] = col[1];
    col4[2] = col[2];
    col4[3] = 1.0f;
    const bool value_changed = ColorEdit4(label, col4, false);
    col[0] = col4[0];
    col[1] = col4[1];
    col[2] = col4[2];
    return value_changed;
}